

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O1

void Curl_flush_cookies(Curl_easy *data,_Bool cleanup)

{
  CookieInfo *cookies;
  char *__s2;
  curl_slist *list;
  bool bVar1;
  char cVar2;
  int iVar3;
  CURLcode CVar4;
  char *__filename;
  FILE *__stream;
  char *__base;
  long lVar5;
  ulong uVar6;
  char *pcVar7;
  Cookie *pCVar8;
  int extraout_EDX;
  ulong uVar9;
  char *pcVar10;
  size_t __nmemb;
  bool bVar11;
  int local_58;
  uchar local_39 [9];
  
  if ((data->set).str[5] == (char *)0x0) {
    if ((cleanup) && (list = (data->change).cookielist, list != (curl_slist *)0x0)) {
      curl_slist_free_all(list);
      (data->change).cookielist = (curl_slist *)0x0;
    }
    Curl_share_lock(data,CURL_LOCK_DATA_COOKIE,CURL_LOCK_ACCESS_SINGLE);
    goto LAB_0010f9bf;
  }
  if ((data->change).cookielist != (curl_slist *)0x0) {
    Curl_cookie_loadfiles(data);
  }
  Curl_share_lock(data,CURL_LOCK_DATA_COOKIE,CURL_LOCK_ACCESS_SINGLE);
  cookies = data->cookies;
  if (cookies == (CookieInfo *)0x0) {
    local_58 = 0;
  }
  else {
    __s2 = (data->set).str[5];
    remove_expired(cookies);
    iVar3 = strcmp("-",__s2);
    if (iVar3 == 0) {
      bVar1 = true;
      __filename = (char *)0x0;
      local_58 = 0x16a001;
      __stream = _stdout;
LAB_0010f7ec:
      fputs("# Netscape HTTP Cookie File\n# https://curl.haxx.se/docs/http-cookies.html\n# This file was generated by libcurl! Edit at your own risk.\n\n"
            ,__stream);
      if (cookies->numcookies != 0) {
        __base = (char *)(*Curl_ccalloc)(1,cookies->numcookies << 3);
        if (__base == (char *)0x0) {
          bVar11 = true;
        }
        else {
          lVar5 = 0;
          __nmemb = 0;
          do {
            for (pCVar8 = cookies->cookies[lVar5]; pCVar8 != (Cookie *)0x0; pCVar8 = pCVar8->next) {
              if (pCVar8->domain != (char *)0x0) {
                *(Cookie **)(__base + __nmemb * 8) = pCVar8;
                __nmemb = __nmemb + 1;
              }
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 != 0x100);
          qsort(__base,__nmemb,8,cookie_sort_ct);
          if (__nmemb != 0) {
            uVar6 = 0;
            uVar9 = 1;
            do {
              pcVar7 = get_netscape_format(*(Cookie **)(__base + uVar6 * 8));
              bVar11 = pcVar7 == (char *)0x0;
              if (bVar11) {
                curl_mfprintf((FILE *)__stream,"#\n# Fatal libcurl error\n");
                pcVar10 = __base;
              }
              else {
                curl_mfprintf((FILE *)__stream,"%s\n",pcVar7);
                pcVar10 = pcVar7;
              }
              (*Curl_cfree)(pcVar10);
              if (pcVar7 == (char *)0x0) goto LAB_0010f90c;
              bVar11 = uVar9 < __nmemb;
              uVar6 = uVar9;
              uVar9 = (ulong)((int)uVar9 + 1);
            } while (bVar11);
          }
          (*Curl_cfree)(__base);
          bVar11 = false;
        }
LAB_0010f90c:
        if (bVar11) {
          local_58 = 1;
          goto LAB_0010f97e;
        }
        if (bVar11) goto LAB_0010f9a0;
      }
      local_58 = 0;
      iVar3 = 0;
      if (__stream == (FILE *)0x0) {
LAB_0010f95c:
        local_58 = iVar3;
        __stream = (FILE *)0x0;
      }
      else if (!bVar1) {
        fclose(__stream);
        iVar3 = Curl_rename(__filename,__s2);
        if (iVar3 != 0) {
          unlink(__filename);
          iVar3 = 1;
          goto LAB_0010f95c;
        }
        __stream = (FILE *)0x0;
        local_58 = 0;
      }
    }
    else {
      CVar4 = Curl_rand_hex(data,local_39,9);
      if (CVar4 == CURLE_OK) {
        __stream = (FILE *)0x0;
        __filename = curl_maprintf("%s.%s.tmp",__s2,local_39);
        if (__filename == (char *)0x0) {
          cVar2 = '\x01';
          __filename = (char *)0x0;
          local_58 = 1;
        }
        else {
          __stream = fopen64(__filename,"w");
          cVar2 = (__stream == (FILE *)0x0) * '\x02';
          local_58 = extraout_EDX;
        }
      }
      else {
        local_58 = 2;
        __stream = (FILE *)0x0;
        __filename = (char *)0x0;
        cVar2 = '\x01';
      }
      bVar1 = false;
      if (cVar2 != '\x02') {
        bVar1 = false;
        if (cVar2 != '\0') goto LAB_0010f9a0;
        goto LAB_0010f7ec;
      }
      local_58 = 1;
    }
LAB_0010f97e:
    if ((__stream != (FILE *)0x0) && (!bVar1)) {
      fclose(__stream);
    }
    (*Curl_cfree)(__filename);
  }
LAB_0010f9a0:
  if (local_58 != 0) {
    Curl_infof(data,"WARNING: failed to save cookies in %s\n",(data->set).str[5]);
  }
LAB_0010f9bf:
  if ((cleanup) && ((data->share == (Curl_share *)0x0 || (data->cookies != data->share->cookies))))
  {
    Curl_cookie_cleanup(data->cookies);
    data->cookies = (CookieInfo *)0x0;
  }
  Curl_share_unlock(data,CURL_LOCK_DATA_COOKIE);
  return;
}

Assistant:

void Curl_flush_cookies(struct Curl_easy *data, bool cleanup)
{
  if(data->set.str[STRING_COOKIEJAR]) {
    if(data->change.cookielist) {
      /* If there is a list of cookie files to read, do it first so that
         we have all the told files read before we write the new jar.
         Curl_cookie_loadfiles() LOCKS and UNLOCKS the share itself! */
      Curl_cookie_loadfiles(data);
    }

    Curl_share_lock(data, CURL_LOCK_DATA_COOKIE, CURL_LOCK_ACCESS_SINGLE);

    /* if we have a destination file for all the cookies to get dumped to */
    if(cookie_output(data, data->cookies, data->set.str[STRING_COOKIEJAR]))
      infof(data, "WARNING: failed to save cookies in %s\n",
            data->set.str[STRING_COOKIEJAR]);
  }
  else {
    if(cleanup && data->change.cookielist) {
      /* since nothing is written, we can just free the list of cookie file
         names */
      curl_slist_free_all(data->change.cookielist); /* clean up list */
      data->change.cookielist = NULL;
    }
    Curl_share_lock(data, CURL_LOCK_DATA_COOKIE, CURL_LOCK_ACCESS_SINGLE);
  }

  if(cleanup && (!data->share || (data->cookies != data->share->cookies))) {
    Curl_cookie_cleanup(data->cookies);
    data->cookies = NULL;
  }
  Curl_share_unlock(data, CURL_LOCK_DATA_COOKIE);
}